

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_arrays_invalid_program
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  local_14 = 0;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             &local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glDrawArrays(&pNStack_10->super_CallLogWrapper,0xffffffff,0,1);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"GL_INVALID_VALUE is generated if count is negative.",&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glDrawArrays(&pNStack_10->super_CallLogWrapper,0,0,-1);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glGenFramebuffers(&pNStack_10->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer(&pNStack_10->super_CallLogWrapper,0x8d40,local_14);
  glu::CallLogWrapper::glCheckFramebufferStatus(&pNStack_10->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawArrays(&pNStack_10->super_CallLogWrapper,0,0,1);
  NegativeTestContext::expectError(pNStack_10,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&pNStack_10->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&pNStack_10->super_CallLogWrapper,1,&local_14);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void draw_arrays_invalid_program (NegativeTestContext& ctx)
{
	GLuint fbo = 0;
	ctx.glUseProgram(0);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawArrays(-1, 0, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawArrays(GL_POINTS, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawArrays(GL_POINTS, 0, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();
}